

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

int ON_Font::AppleWeightOfFontFromWeight(Weight font_weight)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined3 in_register_00000039;
  
  uVar2 = 400;
  if (CONCAT31(in_register_00000039,font_weight) != 0) {
    uVar2 = CONCAT31(in_register_00000039,font_weight) * 100;
  }
  uVar3 = 9;
  if (uVar2 < 0x352) {
    uVar3 = uVar2 * 0x147b >> 0x13;
  }
  uVar1 = 1;
  if (0x95 < uVar2) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

int ON_Font::WindowsLogfontWeightFromWeight(
  ON_Font::Weight font_weight
  )
{
  int logfont_weight = (int)(100U*static_cast<unsigned int>(font_weight));
  if ( logfont_weight < 50 )
    logfont_weight = 400;
  if ( logfont_weight < 150 )
    logfont_weight = 100;
  else if ( logfont_weight >= 850 )
    logfont_weight = 900;
  else if (0 != logfont_weight % 100)
  {
    int delta = logfont_weight %100;
    if (delta < 50)
      logfont_weight -= delta;
    else
      logfont_weight += (100-delta);
  }
  return logfont_weight;
}